

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void TestLogging(bool check_counts)

{
  int iVar1;
  __int_type _Var2;
  ostream *poVar3;
  int *piVar4;
  void *this;
  int64 iVar5;
  SendMethod in_R9;
  CheckOpString local_848;
  LogMessage local_840;
  long local_7e0;
  long local_7d8;
  string *local_7d0;
  _Check_string *_result_2;
  LogMessage local_7c0;
  long local_760;
  long local_758;
  string *local_750;
  _Check_string *_result_1;
  LogMessage local_740;
  long local_6e0;
  long local_6d8;
  string *local_6d0;
  _Check_string *_result;
  LogMessage local_668;
  undefined1 local_608 [8];
  LogMessage outer;
  LogMessage local_5a0;
  int local_53c;
  int local_538;
  allocator<char> local_531;
  string local_530 [32];
  LogMessage local_510;
  int local_4ac;
  undefined1 local_4a8 [4];
  int j;
  char local_448 [8];
  char const_s [12];
  char local_3d8 [8];
  char s [6];
  LogMessageVoidify local_369;
  code *local_368;
  undefined8 uStack_360;
  LogMessage local_358;
  code *local_2f8;
  undefined8 uStack_2f0;
  LogMessage local_2e8;
  code *local_288;
  undefined8 uStack_280;
  LogMessage local_278;
  code *local_218;
  undefined8 uStack_210;
  LogMessage local_208;
  code *local_1a8;
  undefined8 uStack_1a0;
  LogMessage local_198;
  code *local_138;
  undefined8 uStack_130;
  LogMessage local_128;
  int local_c4;
  int local_c0;
  int old_errno;
  int i;
  LogMessage local_88;
  int64 local_28;
  int64 base_num_errors;
  int64 base_num_warning;
  int64 base_num_infos;
  bool check_counts_local;
  
  base_num_infos._7_1_ = check_counts;
  base_num_warning = google::LogMessage::num_messages(0);
  base_num_errors = google::LogMessage::num_messages(1);
  local_28 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x131);
  poVar3 = google::LogMessage::stream(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"foo ",(allocator<char> *)((long)&old_errno + 3));
  poVar3 = std::operator<<(poVar3,(string *)&i);
  poVar3 = std::operator<<(poVar3,"bar ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  poVar3 = std::operator<<(poVar3,' ');
  std::ostream::operator<<(poVar3,3.4);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&old_errno + 3));
  google::LogMessage::~LogMessage(&local_88);
  for (local_c0 = 0; local_c0 < 10; local_c0 = local_c0 + 1) {
    piVar4 = __errno_location();
    iVar1 = local_c0;
    local_c4 = *piVar4;
    piVar4 = __errno_location();
    *piVar4 = iVar1;
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_309.super___atomic_base<int>);
    _Var2 = std::__atomic_base<int>::operator++
                      (&TestLogging::occurrences_mod_n_309.super___atomic_base<int>);
    if (2 < _Var2) {
      std::__atomic_base<int>::operator-=
                (&TestLogging::occurrences_mod_n_309.super___atomic_base<int>,2);
    }
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base *)&TestLogging::occurrences_mod_n_309);
    if (_Var2 == 1) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_309);
      local_138 = google::LogMessage::SendToLog;
      uStack_130 = 0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x135,ERROR,(long)_Var2,in_R9);
      poVar3 = google::LogMessage::stream(&local_128);
      poVar3 = std::operator<<(poVar3,"Plog every 2, iteration ");
      google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_128);
    }
    iVar1 = local_c4;
    piVar4 = __errno_location();
    *piVar4 = iVar1;
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_312.super___atomic_base<int>);
    _Var2 = std::__atomic_base<int>::operator++
                      (&TestLogging::occurrences_mod_n_312.super___atomic_base<int>);
    if (3 < _Var2) {
      std::__atomic_base<int>::operator-=
                (&TestLogging::occurrences_mod_n_312.super___atomic_base<int>,3);
    }
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base *)&TestLogging::occurrences_mod_n_312);
    if (_Var2 == 1) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_312);
      local_1a8 = google::LogMessage::SendToLog;
      uStack_1a0 = 0;
      google::LogMessage::LogMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x138,ERROR,(long)_Var2,in_R9);
      poVar3 = google::LogMessage::stream(&local_198);
      poVar3 = std::operator<<(poVar3,"Log every 3, iteration ");
      poVar3 = google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      google::LogMessage::~LogMessage(&local_198);
    }
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_313.super___atomic_base<int>);
    _Var2 = std::__atomic_base<int>::operator++
                      (&TestLogging::occurrences_mod_n_313.super___atomic_base<int>);
    if (4 < _Var2) {
      std::__atomic_base<int>::operator-=
                (&TestLogging::occurrences_mod_n_313.super___atomic_base<int>,4);
    }
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base *)&TestLogging::occurrences_mod_n_313);
    if (_Var2 == 1) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_313);
      local_218 = google::LogMessage::SendToLog;
      uStack_210 = 0;
      google::LogMessage::LogMessage
                (&local_208,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x139,ERROR,(long)_Var2,in_R9);
      poVar3 = google::LogMessage::stream(&local_208);
      poVar3 = std::operator<<(poVar3,"Log every 4, iteration ");
      poVar3 = google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      google::LogMessage::~LogMessage(&local_208);
    }
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_315.super___atomic_base<int>);
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base *)&TestLogging::occurrences_mod_n_315);
    _Var2 = std::__atomic_base<int>::operator=
                      (&TestLogging::occurrences_mod_n_315.super___atomic_base<int>,(_Var2 + 1) % 5)
    ;
    if (_Var2 == 1) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_315);
      local_288 = google::LogMessage::SendToLog;
      uStack_280 = 0;
      google::LogMessage::LogMessage
                (&local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x13b,GLOG_WARNING,(long)_Var2,in_R9);
      poVar3 = google::LogMessage::stream(&local_278);
      poVar3 = std::operator<<(poVar3,"Log if every 5, iteration ");
      google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
      google::LogMessage::~LogMessage(&local_278);
    }
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_316.super___atomic_base<int>);
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_318.super___atomic_base<int>);
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base *)&TestLogging::occurrences_mod_n_318);
    _Var2 = std::__atomic_base<int>::operator=
                      (&TestLogging::occurrences_mod_n_318.super___atomic_base<int>,(_Var2 + 1) % 1)
    ;
    if (_Var2 == 0) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_318);
      local_2f8 = google::LogMessage::SendToLog;
      uStack_2f0 = 0;
      google::LogMessage::LogMessage
                (&local_2e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x13e,GLOG_INFO,(long)_Var2,in_R9);
      poVar3 = google::LogMessage::stream(&local_2e8);
      poVar3 = std::operator<<(poVar3,"Log if every 1, iteration ");
      google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
      google::LogMessage::~LogMessage(&local_2e8);
    }
    std::__atomic_base<int>::operator++(&TestLogging::occurrences_319.super___atomic_base<int>);
    if (local_c0 < 3) {
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base *)&TestLogging::occurrences_mod_n_319);
      _Var2 = std::__atomic_base<int>::operator=
                        (&TestLogging::occurrences_mod_n_319.super___atomic_base<int>,
                         (_Var2 + 1) % 2);
      if (_Var2 == 1) {
        _Var2 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base *)&TestLogging::occurrences_319);
        local_368 = google::LogMessage::SendToLog;
        uStack_360 = 0;
        google::LogMessage::LogMessage
                  (&local_358,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x13f,ERROR,(long)_Var2,in_R9);
        poVar3 = google::LogMessage::stream(&local_358);
        poVar3 = std::operator<<(poVar3,"Log if less than 3 every 2, iteration ");
        google::operator<<(poVar3,(Counter_t *)&google::COUNTER);
        google::LogMessage::~LogMessage(&local_358);
      }
    }
  }
  google::LogMessageVoidify::LogMessageVoidify(&local_369);
  google::LogMessage::LogMessage
            ((LogMessage *)s,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x142,GLOG_WARNING);
  poVar3 = google::LogMessage::stream((LogMessage *)s);
  poVar3 = std::operator<<(poVar3,"log_if this");
  google::LogMessageVoidify::operator&(&local_369,poVar3);
  google::LogMessage::~LogMessage((LogMessage *)s);
  builtin_strncpy(local_3d8,"array",6);
  google::LogMessage::LogMessage
            ((LogMessage *)(const_s + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x146);
  poVar3 = google::LogMessage::stream((LogMessage *)(const_s + 8));
  std::operator<<(poVar3,local_3d8);
  google::LogMessage::~LogMessage((LogMessage *)(const_s + 8));
  builtin_strncpy(local_448,"const ar",8);
  builtin_strncpy(const_s,"ray",4);
  google::LogMessage::LogMessage
            ((LogMessage *)local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x148);
  poVar3 = google::LogMessage::stream((LogMessage *)local_4a8);
  std::operator<<(poVar3,local_448);
  google::LogMessage::~LogMessage((LogMessage *)local_4a8);
  local_4ac = 1000;
  google::LogMessage::LogMessage
            (&local_510,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14a,ERROR);
  poVar3 = google::LogMessage::stream(&local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"foo",&local_531);
  poVar3 = std::operator<<(poVar3,local_530);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4ac);
  poVar3 = std::operator<<(poVar3,' ');
  local_538 = (int)std::setw(10);
  poVar3 = std::operator<<(poVar3,(_Setw)local_538);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_4ac);
  poVar3 = std::operator<<(poVar3," ");
  local_53c = (int)std::setw(1);
  poVar3 = std::operator<<(poVar3,(_Setw)local_53c);
  this = (void *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(this,local_4ac);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  google::LogMessage::~LogMessage(&local_510);
  google::LogMessage::LogMessage
            (&local_5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14c);
  poVar3 = google::LogMessage::stream(&local_5a0);
  poVar3 = std::operator<<(poVar3,"foo ");
  outer.time_.gmtoffset_.__r._4_4_ = std::setw(10);
  poVar3 = std::operator<<(poVar3,outer.time_.gmtoffset_.__r._4_4_);
  std::ostream::operator<<(poVar3,1.0);
  google::LogMessage::~LogMessage(&local_5a0);
  google::LogMessage::LogMessage
            ((LogMessage *)local_608,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14f,ERROR);
  poVar3 = google::LogMessage::stream((LogMessage *)local_608);
  std::operator<<(poVar3,"outer");
  google::LogMessage::LogMessage
            (&local_668,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x152,ERROR);
  poVar3 = google::LogMessage::stream(&local_668);
  std::operator<<(poVar3,"inner");
  google::LogMessage::~LogMessage(&local_668);
  google::LogMessage::~LogMessage((LogMessage *)local_608);
  google::LogMessage::LogMessage((LogMessage *)&_result,"foo",-1,GLOG_INFO);
  poVar3 = google::LogMessage::stream((LogMessage *)&_result);
  std::operator<<(poVar3,"no prefix");
  google::LogMessage::~LogMessage((LogMessage *)&_result);
  if ((base_num_infos._7_1_ & 1) != 0) {
    local_6d8 = google::GetReferenceableValue(base_num_warning + 0xf);
    iVar5 = google::LogMessage::num_messages(0);
    local_6e0 = google::GetReferenceableValue(iVar5);
    local_6d0 = google::Check_EQImpl<long,long>
                          (&local_6d8,&local_6e0,
                           "base_num_infos + 15 == LogMessage::num_messages(GLOG_INFO)");
    if (local_6d0 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_1,local_6d0);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_740,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x159,(CheckOpString *)&_result_1);
      google::LogMessage::stream(&local_740);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_740);
    }
    local_758 = google::GetReferenceableValue(base_num_errors + 3);
    iVar5 = google::LogMessage::num_messages(1);
    local_760 = google::GetReferenceableValue(iVar5);
    local_750 = google::Check_EQImpl<long,long>
                          (&local_758,&local_760,
                           "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    if (local_750 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_2,local_750);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_7c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15a,(CheckOpString *)&_result_2);
      google::LogMessage::stream(&local_7c0);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7c0);
    }
    local_7d8 = google::GetReferenceableValue(local_28 + 0x11);
    iVar5 = google::LogMessage::num_messages(2);
    local_7e0 = google::GetReferenceableValue(iVar5);
    local_7d0 = google::Check_EQImpl<long,long>
                          (&local_7d8,&local_7e0,
                           "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
    if (local_7d0 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_848,local_7d0);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_840,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15b,&local_848);
      google::LogMessage::stream(&local_840);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_840);
    }
  }
  return;
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for (int i = 0; i < 10; ++i) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' ' << j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;
  LOG(INFO) << "foo " << std::setw(10) << 1.0;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos + 15, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3, LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}